

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_optimization_01.cpp
# Opt level: O0

void optimizaiton_example_01(void)

{
  pointer *ppdVar1;
  allocator<double> *this;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  undefined4 uVar5;
  int iVar6;
  time_t tVar7;
  ostream *poVar8;
  reference pvVar9;
  vector<double,_std::allocator<double>_> local_6d8;
  function<double_()> local_6c0;
  allocator<double> local_699;
  double local_698 [2];
  iterator local_688;
  size_type local_680;
  vector<double,_std::allocator<double>_> local_678;
  allocator<double> local_659;
  double local_658 [2];
  iterator local_648;
  size_type local_640;
  vector<double,_std::allocator<double>_> local_638;
  DreamDomain local_620;
  anon_class_8_1_898c3844 local_600;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  local_5f8;
  function<double_()> local_5d8;
  allocator<double> local_5b1;
  double local_5b0 [2];
  iterator local_5a0;
  size_type local_598;
  vector<double,_std::allocator<double>_> local_590;
  allocator<double> local_571;
  double local_570 [2];
  iterator local_560;
  size_type local_558;
  vector<double,_std::allocator<double>_> local_550;
  ParticleSwarmState local_538 [223];
  allocator<double> local_459;
  undefined1 local_458 [8];
  vector<double,_std::allocator<double>_> values;
  vector<double,_std::allocator<double>_> points;
  double local_420 [2];
  iterator local_410;
  size_type local_408;
  vector<double,_std::allocator<double>_> local_400;
  allocator<double> local_3e1;
  double local_3e0 [2];
  iterator local_3d0;
  size_type local_3c8;
  vector<double,_std::allocator<double>_> local_3c0;
  vector<int,_std::allocator<int>_> local_3a8;
  TasGrid local_390 [8];
  TasmanianSparseGrid grid;
  allocator<double> local_309;
  undefined1 local_308 [8];
  vector<double,_std::allocator<double>_> best_objective;
  vector<double,_std::allocator<double>_> best_position;
  allocator<double> local_2b1;
  double local_2b0 [2];
  iterator local_2a0;
  size_type local_298;
  vector<double,_std::allocator<double>_> local_290;
  allocator<double> local_271;
  double local_270 [2];
  iterator local_260;
  size_type local_258;
  vector<double,_std::allocator<double>_> local_250;
  DreamDomain local_238;
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  local_218;
  undefined8 local_1f8;
  double social_coeff;
  double cognitive_coeff;
  double inertia_weight;
  int num_iterations;
  undefined1 local_1b8 [8];
  ObjectiveFunction objective;
  allocator<double> local_171;
  double local_170 [2];
  iterator local_160;
  size_type local_158;
  vector<double,_std::allocator<double>_> local_150;
  allocator<double> local_121;
  double local_120 [2];
  iterator local_110;
  size_type local_108;
  vector<double,_std::allocator<double>_> local_100;
  ParticleSwarmState local_e8 [8];
  ParticleSwarmState state;
  int num_particles;
  int num_dimensions;
  
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  poVar8 = std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<(poVar8,
                  "---------------------------------------------------------------------------------------------------\n"
                 );
  std::ostream::operator<<((ostream *)&std::cout,std::scientific);
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),5);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "EXAMPLE 1: use the Particle Swarm algorithm to minimize the six-hump camel function\n"
                          );
  poVar8 = std::operator<<(poVar8,
                           "           f(x,y) = (4-2.1 *x^2 + x^4 / 3) * x^2 + x * y + (-4 + 4 * y^2) * y^2\n"
                          );
  poVar8 = std::operator<<(poVar8,"           domain is x in (-3, +3), y in (-2, +2)\n");
  poVar8 = std::operator<<(poVar8,"           using 50 particles and 200 iterations\n");
  std::operator<<(poVar8,"    See the comments in example_optimization_01.cpp\n\n");
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "the problem has two solutions at (-8.98420e-02, 7.12656e-01) and (8.98420e-02, -7.12656e-01)\n"
                          );
  std::operator<<(poVar8,"the objective at the solutions is -1.03163.\n\n");
  TasOptimization::ParticleSwarmState::ParticleSwarmState(local_e8,2,0x32);
  local_120[0] = -3.0;
  local_120[1] = -2.0;
  local_110 = local_120;
  local_108 = 2;
  std::allocator<double>::allocator(&local_121);
  __l_08._M_len = local_108;
  __l_08._M_array = local_110;
  std::vector<double,_std::allocator<double>_>::vector(&local_100,__l_08,&local_121);
  local_170[0] = 3.0;
  local_170[1] = 2.0;
  local_160 = local_170;
  local_158 = 2;
  std::allocator<double>::allocator(&local_171);
  __l_07._M_len = local_158;
  __l_07._M_array = local_160;
  std::vector<double,_std::allocator<double>_>::vector(&local_150,__l_07,&local_171);
  std::function<double()>::function<double(&)(),void>
            ((function<double()> *)&objective._M_invoker,TasDREAM::tsgCoreUniform01);
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
            (local_e8,&local_100,&local_150,&objective._M_invoker);
  std::function<double_()>::~function((function<double_()> *)&objective._M_invoker);
  std::vector<double,_std::allocator<double>_>::~vector(&local_150);
  std::allocator<double>::~allocator(&local_171);
  std::vector<double,_std::allocator<double>_>::~vector(&local_100);
  std::allocator<double>::~allocator(&local_121);
  std::function<double(std::vector<double,std::allocator<double>>const&)>::
  function<optimizaiton_example_01()::__0,void>
            ((function<double(std::vector<double,std::allocator<double>>const&)> *)&num_iterations,
             (anon_class_1_0_00000001 *)((long)&inertia_weight + 7));
  TasOptimization::makeObjectiveFunction
            ((ObjectiveFunction *)local_1b8,2,(ObjectiveFunctionSingle *)&num_iterations);
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::~function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)
             &num_iterations);
  inertia_weight._0_4_ = 200;
  cognitive_coeff = 0.5;
  social_coeff = 2.0;
  local_1f8 = 0x4000000000000000;
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_218,
             (function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)local_1b8);
  local_270[0] = -3.0;
  local_270[1] = -2.0;
  local_260 = local_270;
  local_258 = 2;
  std::allocator<double>::allocator(&local_271);
  __l_06._M_len = local_258;
  __l_06._M_array = local_260;
  std::vector<double,_std::allocator<double>_>::vector(&local_250,__l_06,&local_271);
  local_2b0[0] = 3.0;
  local_2b0[1] = 2.0;
  local_2a0 = local_2b0;
  local_298 = 2;
  std::allocator<double>::allocator(&local_2b1);
  __l_05._M_len = local_298;
  __l_05._M_array = local_2a0;
  std::vector<double,_std::allocator<double>_>::vector(&local_290,__l_05,&local_2b1);
  TasDREAM::hypercube(&local_238,&local_250,&local_290);
  uVar5 = inertia_weight._0_4_;
  dVar4 = cognitive_coeff;
  dVar3 = social_coeff;
  uVar2 = local_1f8;
  ppdVar1 = &best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::function<double()>::function<double(&)(),void>
            ((function<double()> *)ppdVar1,TasDREAM::tsgCoreUniform01);
  TasOptimization::ParticleSwarm
            (SUB84(dVar4,0),dVar3,uVar2,&local_218,&local_238,uVar5,local_e8,ppdVar1);
  std::function<double_()>::~function
            ((function<double_()> *)
             &best_position.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::~function(&local_238);
  std::vector<double,_std::allocator<double>_>::~vector(&local_290);
  std::allocator<double>::~allocator(&local_2b1);
  std::vector<double,_std::allocator<double>_>::~vector(&local_250);
  std::allocator<double>::~allocator(&local_271);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::~function(&local_218);
  TasOptimization::ParticleSwarmState::getBestPosition
            ((vector<double,_std::allocator<double>_> *)
             &best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_e8);
  std::allocator<double>::allocator(&local_309);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_308,1,&local_309);
  std::allocator<double>::~allocator(&local_309);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::operator()((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
                *)local_1b8,
               (vector<double,_std::allocator<double>_> *)
               &best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<double,_std::allocator<double>_> *)local_308);
  poVar8 = std::operator<<((ostream *)&std::cout,"Using the objective function\n");
  poVar8 = std::operator<<(poVar8,"found best position after 200 iteration:\n");
  poVar8 = std::operator<<(poVar8,"best value for x = ");
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar9);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"best value for y = ");
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,1);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar9);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"value of the objective = ");
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_308,0);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar9);
  std::operator<<(poVar8,"\n\n");
  local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_3a8);
  TasGrid::makeLocalPolynomialGrid(local_390,2,1,10,1,rule_localp,&local_3a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3a8);
  local_3e0[0] = -3.0;
  local_3e0[1] = -2.0;
  local_3d0 = local_3e0;
  local_3c8 = 2;
  std::allocator<double>::allocator(&local_3e1);
  __l_04._M_len = local_3c8;
  __l_04._M_array = local_3d0;
  std::vector<double,_std::allocator<double>_>::vector(&local_3c0,__l_04,&local_3e1);
  local_420[0] = 3.0;
  local_420[1] = 2.0;
  local_410 = local_420;
  local_408 = 2;
  this = (allocator<double> *)
         ((long)&points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  __l_03._M_len = local_408;
  __l_03._M_array = local_410;
  std::vector<double,_std::allocator<double>_>::vector(&local_400,__l_03,this);
  TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)local_390,(vector *)&local_3c0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_400);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<double,_std::allocator<double>_>::~vector(&local_3c0);
  std::allocator<double>::~allocator(&local_3e1);
  TasGrid::TasmanianSparseGrid::getNeededPoints
            ((vector<double,_std::allocator<double>_> *)
             &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(TasmanianSparseGrid *)local_390);
  iVar6 = TasGrid::TasmanianSparseGrid::getNumNeeded((TasmanianSparseGrid *)local_390);
  std::allocator<double>::allocator(&local_459);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_458,(long)iVar6,&local_459);
  std::allocator<double>::~allocator(&local_459);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::operator()((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
                *)local_1b8,
               (vector<double,_std::allocator<double>_> *)
               &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<double,_std::allocator<double>_> *)local_458);
  TasGrid::TasmanianSparseGrid::loadNeededValues((vector *)local_390);
  TasOptimization::ParticleSwarmState::ParticleSwarmState(local_538,2,0x32);
  TasOptimization::ParticleSwarmState::operator=(local_e8,local_538);
  TasOptimization::ParticleSwarmState::~ParticleSwarmState(local_538);
  local_570[0] = -3.0;
  local_570[1] = -2.0;
  local_560 = local_570;
  local_558 = 2;
  std::allocator<double>::allocator(&local_571);
  __l_02._M_len = local_558;
  __l_02._M_array = local_560;
  std::vector<double,_std::allocator<double>_>::vector(&local_550,__l_02,&local_571);
  local_5b0[0] = 3.0;
  local_5b0[1] = 2.0;
  local_5a0 = local_5b0;
  local_598 = 2;
  std::allocator<double>::allocator(&local_5b1);
  __l_01._M_len = local_598;
  __l_01._M_array = local_5a0;
  std::vector<double,_std::allocator<double>_>::vector(&local_590,__l_01,&local_5b1);
  std::function<double()>::function<double(&)(),void>
            ((function<double()> *)&local_5d8,TasDREAM::tsgCoreUniform01);
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
            (local_e8,&local_550,&local_590,&local_5d8);
  std::function<double_()>::~function(&local_5d8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_590);
  std::allocator<double>::~allocator(&local_5b1);
  std::vector<double,_std::allocator<double>_>::~vector(&local_550);
  std::allocator<double>::~allocator(&local_571);
  TasGrid::TasmanianSparseGrid::enableAcceleration((TypeAcceleration)local_390);
  local_600.grid = (TasmanianSparseGrid *)local_390;
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::function<optimizaiton_example_01()::__1,void>
            ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
              *)&local_5f8,&local_600);
  local_658[0] = -3.0;
  local_658[1] = -2.0;
  local_648 = local_658;
  local_640 = 2;
  std::allocator<double>::allocator(&local_659);
  __l_00._M_len = local_640;
  __l_00._M_array = local_648;
  std::vector<double,_std::allocator<double>_>::vector(&local_638,__l_00,&local_659);
  local_698[0] = 3.0;
  local_698[1] = 2.0;
  local_688 = local_698;
  local_680 = 2;
  std::allocator<double>::allocator(&local_699);
  __l._M_len = local_680;
  __l._M_array = local_688;
  std::vector<double,_std::allocator<double>_>::vector(&local_678,__l,&local_699);
  TasDREAM::hypercube(&local_620,&local_638,&local_678);
  uVar5 = inertia_weight._0_4_;
  dVar4 = cognitive_coeff;
  dVar3 = social_coeff;
  uVar2 = local_1f8;
  std::function<double()>::function<double(&)(),void>
            ((function<double()> *)&local_6c0,TasDREAM::tsgCoreUniform01);
  TasOptimization::ParticleSwarm
            (SUB84(dVar4,0),dVar3,uVar2,&local_5f8,&local_620,uVar5,local_e8,&local_6c0);
  std::function<double_()>::~function(&local_6c0);
  std::function<bool_(const_std::vector<double,_std::allocator<double>_>_&)>::~function(&local_620);
  std::vector<double,_std::allocator<double>_>::~vector(&local_678);
  std::allocator<double>::~allocator(&local_699);
  std::vector<double,_std::allocator<double>_>::~vector(&local_638);
  std::allocator<double>::~allocator(&local_659);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::~function(&local_5f8);
  TasOptimization::ParticleSwarmState::getBestPosition(&local_6d8,local_e8);
  ppdVar1 = &best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)ppdVar1,&local_6d8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_6d8);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::operator()((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
                *)local_1b8,(vector<double,_std::allocator<double>_> *)ppdVar1,
               (vector<double,_std::allocator<double>_> *)local_308);
  poVar8 = std::operator<<((ostream *)&std::cout,"Using the surrogate to the objective function\n");
  poVar8 = std::operator<<(poVar8,"found best position after 200 iteration:\n");
  poVar8 = std::operator<<(poVar8,"best value for x = ");
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar9);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"best value for y = ");
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,1);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar9);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"value of the objective = ");
  pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_308,0);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar9);
  std::operator<<(poVar8,"\n\n");
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "Note: the method will find only one of the minimums\n");
  std::operator<<(poVar8,"      the random seed will determine which one.\n");
  poVar8 = std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<(poVar8,
                  "---------------------------------------------------------------------------------------------------\n"
                 );
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_458);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_390);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_308);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &best_objective.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::~function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
               *)local_1b8);
  TasOptimization::ParticleSwarmState::~ParticleSwarmState(local_e8);
  return;
}

Assistant:

void optimizaiton_example_01(){
#ifndef __TASMANIAN_DOXYGEN_SKIP
//! [OPT_Example_01 example]
#endif
    // using the default random engine, but must reset the random number generator
    std::srand(std::time(nullptr));

    // Example 1:
    cout << "\n" << "---------------------------------------------------------------------------------------------------\n";
    cout << std::scientific; cout.precision(5);
    cout << "EXAMPLE 1: use the Particle Swarm algorithm to minimize the six-hump camel function\n"
         << "           f(x,y) = (4-2.1 *x^2 + x^4 / 3) * x^2 + x * y + (-4 + 4 * y^2) * y^2\n"
         << "           domain is x in (-3, +3), y in (-2, +2)\n"
         << "           using 50 particles and 200 iterations\n"
         << "    See the comments in example_optimization_01.cpp\n\n";

     cout << "the problem has two solutions at (-8.98420e-02, 7.12656e-01) and (8.98420e-02, -7.12656e-01)\n"
          << "the objective at the solutions is -1.03163.\n\n";

     int num_dimensions = 2;
     int num_particles = 50;

     TasOptimization::ParticleSwarmState state(num_dimensions, num_particles);
     state.initializeParticlesInsideBox({-3.0, -2.0}, {3.0, 2.0});

     auto objective = TasOptimization::makeObjectiveFunction(
                    num_dimensions,
                    [](const std::vector<double> &x)->double {
                         return (4.0 - 2.1 * x[0]*x[0] + x[0]*x[0]*x[0]*x[0] / 3.0) * x[0]*x[0] +
                              x[0] * x[1] +
                              (-4.0 + 4.0 * x[1]*x[1]) * x[1]*x[1];
                    });

     int num_iterations = 200;
     double inertia_weight = 0.5, cognitive_coeff = 2.0, social_coeff = 2.0;
     TasOptimization::ParticleSwarm(objective,
                                    TasDREAM::hypercube({-3.0, -2.0}, {3.0, 2.0}),
                                    inertia_weight, cognitive_coeff, social_coeff,
                                    num_iterations, state);

     std::vector<double> best_position = state.getBestPosition();
     std::vector<double> best_objective(1);
     objective(best_position, best_objective);

     cout << "Using the objective function\n"
          << "found best position after 200 iteration:\n"
          << "best value for x = " << best_position[0] << "\n"
          << "best value for y = " << best_position[1] << "\n"
          << "value of the objective = " << best_objective[0] << "\n\n";


     // solve the same optimization problem, but use a sparse grid surrogate
     // first we create the surrogate, then we optimize

     auto grid = TasGrid::makeLocalPolynomialGrid(2, 1, 10);
     grid.setDomainTransform({-3.0, -2.0}, {3.0, 2.0});

     std::vector<double> points = grid.getNeededPoints();
     std::vector<double> values(grid.getNumNeeded());
     objective(points, values);
     grid.loadNeededValues(values); // at this point, we have the surrogate

     // reset the state
     state = TasOptimization::ParticleSwarmState(num_dimensions, num_particles);
     state.initializeParticlesInsideBox({-3.0, -2.0}, {3.0, 2.0});

     // the values of the objective function for all particle positions are computed in batch
     // thus, the problem is amenable to GPU acceleration
     // Note: if GPU acceleration is not available, Tasmanian will automatically fallback to CPU
     grid.enableAcceleration(TasGrid::accel_gpu_cuda);
     TasOptimization::ParticleSwarm(
                              [&](std::vector<double> const &x, std::vector<double> &y)->void{
                                   grid.evaluateBatch(x, y);
                              },
                              TasDREAM::hypercube({-3.0, -2.0}, {3.0, 2.0}),
                              inertia_weight, cognitive_coeff, social_coeff,
                              num_iterations, state);

     best_position = state.getBestPosition();
     objective(best_position, best_objective);

     cout << "Using the surrogate to the objective function\n"
          << "found best position after 200 iteration:\n"
          << "best value for x = " << best_position[0] << "\n"
          << "best value for y = " << best_position[1] << "\n"
          << "value of the objective = " << best_objective[0] << "\n\n";

     cout << "Note: the method will find only one of the minimums\n"
          << "      the random seed will determine which one.\n";


    cout << "\n" << "---------------------------------------------------------------------------------------------------\n";
#ifndef __TASMANIAN_DOXYGEN_SKIP
//! [OPT_Example_01 example]
#endif
}